

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O2

void __thiscall
google::
dense_hashtable<std::__cxx11::string,std::__cxx11::string,Hasher,google::dense_hash_set<std::__cxx11::string,Hasher,Hasher,google::libc_allocator_with_realloc<std::__cxx11::string>>::Identity,google::dense_hash_set<std::__cxx11::string,Hasher,Hasher,google::libc_allocator_with_realloc<std::__cxx11::string>>::SetKey,Hasher,google::libc_allocator_with_realloc<std::__cxx11::string>>
::set_value<std::__cxx11::string>
          (dense_hashtable<std::__cxx11::string,std::__cxx11::string,Hasher,google::dense_hash_set<std::__cxx11::string,Hasher,Hasher,google::libc_allocator_with_realloc<std::__cxx11::string>>::Identity,google::dense_hash_set<std::__cxx11::string,Hasher,Hasher,google::libc_allocator_with_realloc<std::__cxx11::string>>::SetKey,Hasher,google::libc_allocator_with_realloc<std::__cxx11::string>>
           *this,pointer dst,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args
          )

{
  std::__cxx11::string::~string((string *)dst);
  std::__cxx11::string::string((string *)dst,(string *)args);
  return;
}

Assistant:

void set_value(pointer dst, Args&&... args) {
    dst->~value_type();  // delete the old value, if any
    new (dst) value_type(std::forward<Args>(args)...);
  }